

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void rd_3dim(char **content,size_t *line_no,int *array,int *dim,int *shift)

{
  int local_3c [2];
  int post [3];
  int *shift_local;
  int *dim_local;
  int *array_local;
  size_t *line_no_local;
  char **content_local;
  
  post._4_8_ = shift;
  memset(local_3c,0,0xc);
  rd_3dim_slice(content,line_no,array,dim,(int *)post._4_8_,local_3c);
  return;
}

Assistant:

PRIVATE void
rd_3dim(char    **content,
        size_t  *line_no,
        int     *array,
        int     dim[3],
        int     shift[3])
{
  int post[3] = {
    0, 0, 0
  };

  rd_3dim_slice(content, line_no, array,
                dim,
                shift,
                post);
}